

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadSSC32x(SSC32 *pSSC32)

{
  int local_1c;
  int id;
  SSC32 *pSSC32_local;
  
  local_1c = 0;
  do {
    if ((SSC32 *)addrsSSC32[local_1c] == pSSC32) {
      bExitSSC32[local_1c] = 1;
      WaitForThread(SSC32ThreadId[local_1c]);
      DeleteCriticalSection(SSC32CS + local_1c);
      resSSC32[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadSSC32x(SSC32* pSSC32)
{
	int id = 0;

	while (addrsSSC32[id] != pSSC32)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitSSC32[id] = TRUE;
	WaitForThread(SSC32ThreadId[id]);
	DeleteCriticalSection(&SSC32CS[id]);
	resSSC32[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}